

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

int expand_rule(jsgf_t *grammar,jsgf_rule_t *rule)

{
  long lVar1;
  int iVar2;
  glist_t pgVar3;
  gnode_t *pgVar4;
  jsgf_atom_t *atom_1;
  int lastnode;
  jsgf_atom_t *atom;
  jsgf_rhs_t *pjStack_28;
  float norm;
  jsgf_rhs_t *rhs;
  jsgf_rule_t *rule_local;
  jsgf_t *grammar_local;
  
  pgVar3 = glist_add_ptr(grammar->rulestack,rule);
  grammar->rulestack = pgVar3;
  atom._4_4_ = 0.0;
  for (pjStack_28 = rule->rhs; pjStack_28 != (jsgf_rhs_t *)0x0; pjStack_28 = pjStack_28->alt) {
    if (pjStack_28->atoms != (glist_t)0x0) {
      atom._4_4_ = *(float *)((pjStack_28->atoms->data).i + 0x10) + atom._4_4_;
    }
  }
  iVar2 = grammar->nstate;
  grammar->nstate = iVar2 + 1;
  rule->entry = iVar2;
  iVar2 = grammar->nstate;
  grammar->nstate = iVar2 + 1;
  rule->exit = iVar2;
  if ((atom._4_4_ == 0.0) && (!NAN(atom._4_4_))) {
    atom._4_4_ = 1.0;
  }
  pjStack_28 = rule->rhs;
  while( true ) {
    if (pjStack_28 == (jsgf_rhs_t *)0x0) {
      pgVar4 = gnode_free(grammar->rulestack,(gnode_t *)0x0);
      grammar->rulestack = pgVar4;
      return rule->exit;
    }
    if (pjStack_28->atoms != (glist_t)0x0) {
      lVar1 = (pjStack_28->atoms->data).i;
      *(float *)(lVar1 + 0x10) = *(float *)(lVar1 + 0x10) / atom._4_4_;
    }
    iVar2 = expand_rhs(grammar,rule,pjStack_28);
    if (iVar2 == -1) break;
    if (iVar2 != -2) {
      jsgf_add_link(grammar,(jsgf_atom_t *)0x0,iVar2,rule->exit);
    }
    pjStack_28 = pjStack_28->alt;
  }
  return -1;
}

Assistant:

static int
expand_rule(jsgf_t * grammar, jsgf_rule_t * rule)
{
    jsgf_rhs_t *rhs;
    float norm;

    /* Push this rule onto the stack */
    grammar->rulestack = glist_add_ptr(grammar->rulestack, rule);

    /* Normalize weights for all alternatives exiting rule->entry */
    norm = 0;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
            norm += atom->weight;
        }
    }

    rule->entry = grammar->nstate++;
    rule->exit = grammar->nstate++;
    if (norm == 0) norm = 1;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        int lastnode;

        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
	    atom->weight /= norm;
        }
        lastnode = expand_rhs(grammar, rule, rhs);
        if (lastnode == -1) {
            return -1;
        }
        else if (lastnode == RECURSION) {
            /* Do nothing. */
        }
        else {
            jsgf_add_link(grammar, NULL, lastnode, rule->exit);
        }
    }

    /* Pop this rule from the rule stack */
    grammar->rulestack = gnode_free(grammar->rulestack, NULL);
    return rule->exit;
}